

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# src_backend_nodes_makefuncs.cpp
# Opt level: O2

PGTypeName * duckdb_libpgquery::makeTypeNameFromNameList(PGList *names)

{
  PGTypeName *pPVar1;
  
  pPVar1 = (PGTypeName *)newNode(0x38,T_PGTypeName);
  pPVar1->names = names;
  pPVar1->typmods = (PGList *)0x0;
  pPVar1->typemod = -1;
  pPVar1->location = -1;
  return pPVar1;
}

Assistant:

PGTypeName *makeTypeNameFromNameList(PGList *names) {
	PGTypeName *n = makeNode(PGTypeName);

	n->names = names;
	n->typmods = NIL;
	n->typemod = -1;
	n->location = -1;
	return n;
}